

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_fetch_resp(connectdata *conn,int imapcode,imapstate instate)

{
  SessionHandle *data_00;
  FTP *pFVar1;
  CURLcode CVar2;
  anon_union_208_8_f709340f_for_proto *paVar3;
  bool bVar4;
  ulong local_60;
  size_t chunk;
  curl_off_t filesize;
  char *ptr;
  pingpong *pp;
  FTP *imap;
  imap_conn *imapc;
  SessionHandle *data;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  paVar3 = &conn->proto;
  pFVar1 = (data_00->state).proto.ftp;
  filesize = (curl_off_t)(data_00->state).buffer;
  if (imapcode == 0x2a) {
    while( true ) {
      bVar4 = false;
      if (*(char *)filesize != '\0') {
        bVar4 = *(char *)filesize != '{';
      }
      if (!bVar4) break;
      filesize = filesize + 1;
    }
    if (*(char *)filesize == '{') {
      chunk = strtol((char *)(filesize + 1),(char **)0x0,10);
      if (chunk != 0) {
        Curl_pgrsSetDownloadSize(data_00,chunk);
      }
      Curl_infof(data_00,"Found %lu bytes to download\n",chunk);
      if ((paVar3->ftpc).pp.cache != (char *)0x0) {
        local_60 = (conn->proto).rtspc.rtp_bufsize;
        if (chunk < local_60) {
          local_60 = chunk;
        }
        CVar2 = Curl_client_write(conn,1,(paVar3->ftpc).pp.cache,local_60);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        chunk = chunk - local_60;
        if (local_60 < (conn->proto).ftpc.pp.cache_size) {
          memmove(paVar3->generic,(paVar3->ftpc).pp.cache + local_60,
                  (conn->proto).ftpc.pp.cache_size - local_60);
          (conn->proto).ftpc.pp.cache_size = (conn->proto).ftpc.pp.cache_size - local_60;
        }
        else {
          (*Curl_cfree)((paVar3->ftpc).pp.cache);
          (paVar3->ftpc).pp.cache = (char *)0x0;
          (conn->proto).ftpc.pp.cache_size = 0;
        }
      }
      data._4_4_ = CURLE_OK;
      Curl_infof(data_00,"Filesize left: %ld\n",chunk);
      if (chunk == 0) {
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
      }
      else {
        Curl_setup_transfer(conn,0,chunk,false,pFVar1->bytecountp,-1,(curl_off_t *)0x0);
      }
      (data_00->req).maxdownload = chunk;
    }
    else {
      data._4_4_ = CURLE_FTP_WEIRD_SERVER_REPLY;
    }
    state(conn,IMAP_STOP);
    conn_local._4_4_ = data._4_4_;
  }
  else {
    Curl_pgrsSetDownloadSize(data_00,0);
    state(conn,IMAP_STOP);
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_state_fetch_resp(struct connectdata *conn,
                                      int imapcode,
                                      imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct FTP *imap = data->state.proto.imap;
  struct pingpong *pp = &imapc->pp;
  const char *ptr = data->state.buffer;

  (void)instate; /* no use for this yet */

  if('*' != imapcode) {
    Curl_pgrsSetDownloadSize(data, 0);
    state(conn, IMAP_STOP);
    return CURLE_OK;
  }

  /* Something like this comes "* 1 FETCH (BODY[TEXT] {2021}\r" */
  while(*ptr && (*ptr != '{'))
    ptr++;

  if(*ptr == '{') {
    curl_off_t filesize = curlx_strtoofft(ptr+1, NULL, 10);
    if(filesize)
      Curl_pgrsSetDownloadSize(data, filesize);

    infof(data, "Found %" FORMAT_OFF_TU " bytes to download\n", filesize);

    if(pp->cache) {
      /* At this point there is a bunch of data in the header "cache" that is
         actually body content, send it as body and then skip it. Do note
         that there may even be additional "headers" after the body. */
      size_t chunk = pp->cache_size;

      if(chunk > (size_t)filesize)
        /* the conversion from curl_off_t to size_t is always fine here */
        chunk = (size_t)filesize;

      result = Curl_client_write(conn, CLIENTWRITE_BODY, pp->cache, chunk);
      if(result)
        return result;

      filesize -= chunk;

      /* we've now used parts of or the entire cache */
      if(pp->cache_size > chunk) {
        /* part of, move the trailing data to the start and reduce the size */
        memmove(pp->cache, pp->cache+chunk,
                pp->cache_size - chunk);
        pp->cache_size -= chunk;
      }
      else {
        /* cache is drained */
        free(pp->cache);
        pp->cache = NULL;
        pp->cache_size = 0;
      }
    }

    infof(data, "Filesize left: %" FORMAT_OFF_T "\n", filesize);

    if(!filesize)
      /* the entire data is already transferred! */
      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
    else
      /* IMAP download */
      Curl_setup_transfer(conn, FIRSTSOCKET, filesize, FALSE,
                          imap->bytecountp, -1, NULL); /* no upload here */

    data->req.maxdownload = filesize;
  }
  else
    /* We don't know how to parse this line */
    result = CURLE_FTP_WEIRD_SERVER_REPLY; /* TODO: fix this code */

  state(conn, IMAP_STOP);

  return result;
}